

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
           *__return_storage_ptr__,v10 *this,unsigned_long *args,unsigned_long *args_1)

{
  unsigned_long uVar1;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_90;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  size_t local_70;
  
  uVar1 = *args;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[1].field_0.ulong_long_value = uVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_70;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}